

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::anon_unknown_6::BuildXformNodeFromStageRec
               (Stage *stage,Path *parent_abs_path,Prim *prim,XformNode *nodeOut,matrix4d rootMat,
               double t,TimeSampleInterpolationType tinterp)

{
  Path *pPVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  matrix4d *pmVar6;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  *psVar7;
  matrix4d *pmVar8;
  double *pdVar9;
  double *pdVar10;
  undefined8 *puVar11;
  Path *parent_abs_path_00;
  byte bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  matrix4d in_stack_fffffffffffff878;
  bool resetXformStack;
  TimeSampleInterpolationType local_6fc;
  double local_6f8;
  Prim *local_6f0;
  double local_6e8;
  double dStack_6e0;
  double local_6d8;
  double dStack_6d0;
  double local_6c8;
  double dStack_6c0;
  double local_6b8;
  double dStack_6b0;
  double local_6a8;
  double dStack_6a0;
  double local_698;
  double dStack_690;
  matrix4d localMat;
  undefined1 local_3d8 [240];
  Prim *local_2e8;
  size_type local_2e0;
  vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_> local_2d0;
  undefined2 local_2b8;
  double local_2b0;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  double local_280;
  double dStack_278;
  double local_270;
  double dStack_268;
  double local_260;
  double local_258;
  double dStack_250;
  double local_248;
  double dStack_240;
  double local_238;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_230;
  double local_200;
  double dStack_1f8;
  double local_1f0;
  double dStack_1e8;
  double local_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  double local_1b0 [16];
  matrix4d worldMat;
  matrix4d ret;
  
  pdVar9 = (double *)(ulong)tinterp;
  bVar12 = 0;
  local_6fc = (TimeSampleInterpolationType)nodeOut;
  if (prim == (Prim *)0x0) {
    bVar2 = false;
  }
  else {
    local_6f8 = t;
    local_6f0 = prim;
    XformNode::XformNode((XformNode *)local_3d8);
    ::std::__cxx11::string::_M_assign((string *)local_3d8);
    Path::AppendPrim((Path *)&localMat,(Path *)stage,(string *)(parent_abs_path + 2));
    Path::operator=((Path *)(local_3d8 + 0x20),(Path *)&localMat);
    Path::~Path((Path *)&localMat);
    local_2e0 = parent_abs_path[3]._element._M_string_length;
    local_2e8 = (Prim *)parent_abs_path;
    bVar2 = IsXformablePrim((Prim *)parent_abs_path);
    if (bVar2) {
      resetXformStack = false;
      GetLocalTransform(&localMat,(Prim *)parent_abs_path,&resetXformStack,local_6f8,local_6fc);
      pmVar6 = &rootMat;
      pmVar8 = &worldMat;
      for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
        pmVar8->m[0][0] = pmVar6->m[0][0];
        pmVar6 = (matrix4d *)((long)pmVar6 + ((ulong)bVar12 * -2 + 1) * 8);
        pmVar8 = (matrix4d *)((long)pmVar8 + ((ulong)bVar12 * -2 + 1) * 8);
      }
      local_2b8._1_1_ = resetXformStack;
      if (resetXformStack == true) {
        uVar13 = SUB84(localMat.m[0][0],0);
        uVar14 = (undefined4)((ulong)localMat.m[0][0] >> 0x20);
        local_6a8 = localMat.m[0][1];
        dStack_6a0 = localMat.m[0][2];
        local_698 = localMat.m[0][3];
        dStack_690 = localMat.m[1][0];
        uVar15 = SUB84(localMat.m[1][1],0);
        uVar16 = (undefined4)((ulong)localMat.m[1][1] >> 0x20);
        local_6c8 = localMat.m[1][2];
        dStack_6c0 = localMat.m[1][3];
        local_6b8 = localMat.m[2][0];
        dStack_6b0 = localMat.m[2][1];
        uVar17 = SUB84(localMat.m[2][2],0);
        uVar18 = (undefined4)((ulong)localMat.m[2][2] >> 0x20);
        local_6e8 = localMat.m[2][3];
        dStack_6e0 = localMat.m[3][0];
        local_6d8 = localMat.m[3][1];
        dStack_6d0 = localMat.m[3][2];
        uVar19 = SUB84(localMat.m[3][3],0);
        uVar20 = (undefined4)((ulong)localMat.m[3][3] >> 0x20);
      }
      else {
        tinyusdz::value::Mult<tinyusdz::value::matrix4d,double,4ul>
                  (&ret,(value *)&localMat,&worldMat,(matrix4d *)0x0);
        uVar13 = SUB84(ret.m[0][0],0);
        uVar14 = (undefined4)((ulong)ret.m[0][0] >> 0x20);
        local_6a8 = ret.m[0][1];
        dStack_6a0 = ret.m[0][2];
        local_698 = ret.m[0][3];
        dStack_690 = ret.m[1][0];
        uVar15 = SUB84(ret.m[1][1],0);
        uVar16 = (undefined4)((ulong)ret.m[1][1] >> 0x20);
        local_6c8 = ret.m[1][2];
        dStack_6c0 = ret.m[1][3];
        local_6b8 = ret.m[2][0];
        dStack_6b0 = ret.m[2][1];
        uVar17 = SUB84(ret.m[2][2],0);
        uVar18 = (undefined4)((ulong)ret.m[2][2] >> 0x20);
        local_6e8 = ret.m[2][3];
        dStack_6e0 = ret.m[3][0];
        local_6d8 = ret.m[3][1];
        dStack_6d0 = ret.m[3][2];
        uVar19 = SUB84(ret.m[3][3],0);
        uVar20 = (undefined4)((ulong)ret.m[3][3] >> 0x20);
      }
      lVar4 = 0x10;
      pmVar6 = &rootMat;
      pdVar9 = local_1b0;
      for (lVar5 = lVar4; lVar5 != 0; lVar5 = lVar5 + -1) {
        *pdVar9 = pmVar6->m[0][0];
        pmVar6 = (matrix4d *)((long)pmVar6 + ((ulong)bVar12 * -2 + 1) * 8);
        pdVar9 = pdVar9 + (ulong)bVar12 * -2 + 1;
      }
      pdVar9 = &local_2b0;
      pmVar6 = &localMat;
      pdVar10 = pdVar9;
      for (; lVar4 != 0; lVar4 = lVar4 + -1) {
        *pdVar10 = pmVar6->m[0][0];
        pmVar6 = (matrix4d *)((long)pmVar6 + ((ulong)bVar12 * -2 + 1) * 8);
        pdVar10 = pdVar10 + (ulong)bVar12 * -2 + 1;
      }
      local_230._4_4_ = uVar14;
      local_230._0_4_ = uVar13;
      local_230._8_8_ = local_6a8;
      local_230._16_8_ = dStack_6a0;
      local_230._24_8_ = local_698;
      local_230._32_8_ = dStack_690;
      local_230._40_8_ = CONCAT44(uVar16,uVar15);
      local_200 = local_6c8;
      dStack_1f8 = dStack_6c0;
      local_1f0 = local_6b8;
      dStack_1e8 = dStack_6b0;
      local_1e0 = (double)CONCAT44(uVar18,uVar17);
      local_1d8 = local_6e8;
      dStack_1d0 = dStack_6e0;
      local_1c8 = local_6d8;
      dStack_1c0 = dStack_6d0;
      local_1b8 = (double)CONCAT44(uVar20,uVar19);
      local_2b8._0_1_ = true;
    }
    else {
      local_2b8._0_1_ = false;
      local_2b8._1_1_ = false;
      lVar4 = 0x10;
      pmVar6 = &rootMat;
      pdVar10 = local_1b0;
      for (lVar5 = lVar4; lVar5 != 0; lVar5 = lVar5 + -1) {
        *pdVar10 = pmVar6->m[0][0];
        pmVar6 = (matrix4d *)((long)pmVar6 + ((ulong)bVar12 * -2 + 1) * 8);
        pdVar10 = pdVar10 + (ulong)bVar12 * -2 + 1;
      }
      pmVar6 = &rootMat;
      psVar7 = &local_230;
      for (; lVar4 != 0; lVar4 = lVar4 + -1) {
        *(double *)psVar7 = pmVar6->m[0][0];
        pmVar6 = (matrix4d *)((long)pmVar6 + ((ulong)bVar12 * -2 + 1) * 8);
        psVar7 = (storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                  *)((long)psVar7 + ((ulong)bVar12 * -2 + 1) * 8);
      }
      local_298 = 0.0;
      dStack_290 = 0.0;
      local_2a8 = 0.0;
      dStack_2a0 = 0.0;
      local_280 = 0.0;
      dStack_278 = 0.0;
      local_270 = 0.0;
      dStack_268 = 0.0;
      local_258 = 0.0;
      dStack_250 = 0.0;
      local_248 = 0.0;
      dStack_240 = 0.0;
      local_2b0 = 1.0;
      local_288 = 1.0;
      local_260 = 1.0;
      local_238 = 1.0;
    }
    pPVar1 = (Path *)parent_abs_path[3]._variant_part._M_string_length;
    for (parent_abs_path_00 = (Path *)parent_abs_path[3]._variant_part._M_dataplus._M_p;
        bVar2 = parent_abs_path_00 == pPVar1, !bVar2;
        parent_abs_path_00 = (Path *)&parent_abs_path_00[4]._prim_part.field_2) {
      XformNode::XformNode((XformNode *)&localMat);
      psVar7 = &local_230;
      puVar11 = (undefined8 *)&stack0xfffffffffffff878;
      for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar11 = *(undefined8 *)psVar7;
        psVar7 = (storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                  *)((long)psVar7 + ((ulong)bVar12 * -2 + 1) * 8);
        puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
      }
      bVar3 = BuildXformNodeFromStageRec
                        ((Stage *)(local_3d8 + 0x20),parent_abs_path_00,(Prim *)&localMat,
                         (XformNode *)(ulong)local_6fc,in_stack_fffffffffffff878,local_6f8,
                         (TimeSampleInterpolationType)pdVar9);
      if (!bVar3) {
        XformNode::~XformNode((XformNode *)&localMat);
        goto LAB_003b944c;
      }
      ::std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>::
      emplace_back<tinyusdz::tydra::XformNode>(&local_2d0,(XformNode *)&localMat);
      XformNode::~XformNode((XformNode *)&localMat);
    }
    XformNode::operator=((XformNode *)local_6f0,(XformNode *)local_3d8);
LAB_003b944c:
    XformNode::~XformNode((XformNode *)local_3d8);
  }
  return bVar2;
}

Assistant:

bool BuildXformNodeFromStageRec(
    const tinyusdz::Stage &stage, const Path &parent_abs_path, const Prim *prim,
    XformNode *nodeOut, /* out */
    value::matrix4d rootMat, const double t,
    const tinyusdz::value::TimeSampleInterpolationType tinterp) {
  if (!nodeOut) {
    return false;
  }

  XformNode node;

  if (prim->element_name().empty()) {
    // TODO: report error
  }

  node.element_name = prim->element_name();
  node.absolute_path = parent_abs_path.AppendPrim(prim->element_name());
  node.prim_id = prim->prim_id();
  node.prim = prim;  // Assume Prim's address does not change.

  DCOUT(prim->element_name() << ": IsXformablePrim" << IsXformablePrim(*prim));

  if (IsXformablePrim(*prim)) {
    bool resetXformStack{false};

    value::matrix4d localMat =
        GetLocalTransform(*prim, &resetXformStack, t, tinterp);
    DCOUT("local mat = " << localMat);

    value::matrix4d worldMat = rootMat;
    node.has_resetXformStack() = resetXformStack;

    value::matrix4d m;

    if (resetXformStack) {
      // Ignore parent Xform.
      m = localMat;
    } else {
      // matrix is row-major, so local first
      m = localMat * worldMat;
    }

    node.set_parent_world_matrix(rootMat);
    node.set_local_matrix(localMat);
    node.set_world_matrix(m);
    node.has_xform() = true;
  } else {
    DCOUT("Not xformable");
    node.has_xform() = false;
    node.has_resetXformStack() = false;
    node.set_parent_world_matrix(rootMat);
    node.set_world_matrix(rootMat);
    node.set_local_matrix(value::matrix4d::identity());
  }

  for (const auto &childPrim : prim->children()) {
    XformNode childNode;
    if (!BuildXformNodeFromStageRec(stage, node.absolute_path, &childPrim,
                                    &childNode, node.get_world_matrix(), t,
                                    tinterp)) {
      return false;
    }

    childNode.parent = &node;
    node.children.emplace_back(std::move(childNode));
  }

  (*nodeOut) = node;

  return true;
}